

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O0

void __thiscall PixelToaster::UnixDisplay::handleEvent(UnixDisplay *this,XEvent *event)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  undefined2 uVar4;
  Code CVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  UnixDisplay *local_110;
  UnixDisplay *local_100;
  UnixDisplay *local_f0;
  UnixDisplay *local_e0;
  UnixDisplay *local_d0;
  undefined1 uStack_89;
  Mouse mouse_1;
  undefined1 uStack_45;
  Mouse mouse;
  Key local_34;
  Key KStack_30;
  bool defaultKeyHandlers;
  Key local_2c;
  uint local_28;
  Key key;
  int loSym;
  int hiSym;
  KeySym keySym;
  XEvent *event_local;
  UnixDisplay *this_local;
  
  switch(event->type) {
  case 2:
  case 3:
    uVar4 = XkbKeycodeToKeysym(this->display_,(event->xmotion).is_hint,0);
    loSym._1_1_ = (byte)((ushort)uVar4 >> 8);
    key.code = (Code)loSym._1_1_;
    loSym._0_1_ = (byte)uVar4;
    local_28 = (uint)(byte)loSym;
    Key::Key(&local_2c,Undefined);
    if (key.code == Undefined) {
      Key::Key(&stack0xffffffffffffffd0,*(Code *)(normalKeys_ + (long)(int)local_28 * 4));
      local_2c.code = KStack_30.code;
    }
    else if (key.code == 0xff) {
      Key::Key(&local_34,*(Code *)(functionKeys_ + (long)(int)local_28 * 4));
      local_2c.code = local_34.code;
    }
    if (event->type == 2) {
      CVar5 = Key::operator_cast_to_Code(&local_2c);
      if ((keyIsPressed_[CVar5] & 1) == 0) {
        mouse.y._3_1_ = 1;
        iVar9 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])()
        ;
        if (CONCAT44(extraout_var,iVar9) != 0) {
          iVar9 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                            ();
          iVar10 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                     [0x10])();
          local_d0 = this;
          if (CONCAT44(extraout_var_01,iVar10) != 0) {
            uVar11 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                       [0x10])();
            local_d0 = (UnixDisplay *)(ulong)uVar11;
          }
          (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x18))
                    ((long *)CONCAT44(extraout_var_00,iVar9),local_d0,local_2c.code);
          iVar9 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])
                            ();
          bVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar9) + 0x10))();
          mouse.y._3_1_ = bVar3 & 1;
        }
        if ((mouse.y._3_1_ != 0) && (CVar5 = Key::operator_cast_to_Code(&local_2c), CVar5 == Escape)
           ) {
          this->isShuttingDown_ = true;
        }
      }
      CVar5 = Key::operator_cast_to_Code(&local_2c);
      keyIsPressed_[CVar5] = 1;
      CVar5 = Key::operator_cast_to_Code(&local_2c);
      keyIsReleased_[CVar5] = 0;
    }
    else {
      CVar5 = Key::operator_cast_to_Code(&local_2c);
      keyIsReleased_[CVar5] = 1;
    }
    break;
  case 4:
  case 5:
    iVar9 = (event->xkey).x;
    iVar10 = (event->xkey).y;
    bVar13 = (event->xkey).keycode == 1;
    bVar14 = (event->xkey).keycode == 2;
    bVar15 = (event->xkey).keycode == 3;
    if (event->type == 4) {
      iVar6 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])();
      if (CONCAT44(extraout_var_03,iVar6) != 0) {
        iVar6 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])()
        ;
        iVar7 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          ();
        local_e0 = this;
        if (CONCAT44(extraout_var_05,iVar7) != 0) {
          uVar11 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                     [0x10])();
          local_e0 = (UnixDisplay *)(ulong)uVar11;
        }
        (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x30))
                  ((float)iVar10,(long *)CONCAT44(extraout_var_04,iVar6),local_e0,
                   CONCAT44((float)iVar9,
                            CONCAT13(uStack_45,CONCAT12(bVar15,CONCAT11(bVar14,bVar13)))));
      }
    }
    else {
      iVar6 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])();
      if (CONCAT44(extraout_var_06,iVar6) != 0) {
        iVar6 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])()
        ;
        iVar7 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          ();
        local_f0 = this;
        if (CONCAT44(extraout_var_08,iVar7) != 0) {
          uVar11 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                     [0x10])();
          local_f0 = (UnixDisplay *)(ulong)uVar11;
        }
        (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar6) + 0x38))
                  ((float)iVar10,(long *)CONCAT44(extraout_var_07,iVar6),local_f0,
                   CONCAT44((float)iVar9,
                            CONCAT13(uStack_45,CONCAT12(bVar15,CONCAT11(bVar14,bVar13)))));
      }
    }
    break;
  case 6:
    iVar9 = (event->xkey).x;
    iVar10 = (event->xkey).y;
    uVar11 = (event->xkey).state;
    uVar1 = (event->xkey).state;
    uVar2 = (event->xkey).state;
    iVar6 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])();
    if (CONCAT44(extraout_var_09,iVar6) != 0) {
      iVar6 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])();
      iVar7 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])();
      local_100 = this;
      if (CONCAT44(extraout_var_11,iVar7) != 0) {
        uVar8 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          ();
        local_100 = (UnixDisplay *)(ulong)uVar8;
      }
      (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 0x40))
                ((float)iVar10,(long *)CONCAT44(extraout_var_10,iVar6),local_100,
                 CONCAT44((float)iVar9,
                          CONCAT13(uStack_89,
                                   CONCAT12((uVar2 & 0x400) != 0,
                                            CONCAT11((uVar1 & 0x200) != 0,(uVar11 & 0x100) != 0)))))
      ;
    }
    break;
  case 0x21:
    if ((((event->xkey).root == this->wmProtocols_) && ((event->xexpose).width == 0x20)) &&
       ((event->xkey).time == this->wmDeleteWindow_)) {
      iVar9 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])();
      if (CONCAT44(extraout_var_12,iVar9) == 0) {
        this->isShuttingDown_ = true;
      }
      else {
        iVar9 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0xe])()
        ;
        iVar10 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                           ();
        local_110 = this;
        if (CONCAT44(extraout_var_14,iVar10) != 0) {
          uVar11 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                     [0x10])();
          local_110 = (UnixDisplay *)(ulong)uVar11;
        }
        uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar9) + 0x58))
                           ((long *)CONCAT44(extraout_var_13,iVar9),local_110);
        if ((uVar12 & 1) != 0) {
          this->isShuttingDown_ = true;
        }
      }
    }
  }
  return;
}

Assistant:

void handleEvent(const ::XEvent& event)
    {
        switch (event.type)
        {
            case KeyPress:
            case KeyRelease:
            {
                const KeySym keySym = ::XkbKeycodeToKeysym(display_, event.xkey.keycode, 0, 0);
                const int    hiSym  = (keySym & 0xff00) >> 8;
                const int    loSym  = keySym & 0xff;

                Key key = Key::Undefined;
                switch (hiSym)
                {
                    case 0x00:
                        key = normalKeys_[loSym];
                        break;
                    case 0xff:
                        key = functionKeys_[loSym];
                        break;
                }

                if (event.type == KeyPress)
                {
                    if (!keyIsPressed_[key])
                    {
                        bool defaultKeyHandlers = true;

                        if (listener())
                        {
                            listener()->onKeyDown(wrapper() ? *wrapper() : *(DisplayInterface*)this, key);
                            defaultKeyHandlers = listener()->defaultKeyHandlers();
                        }

                        if (defaultKeyHandlers && key == Key::Escape)
                        {
                            isShuttingDown_ = true;
                        }
                    }
                    keyIsPressed_[key]  = true;
                    keyIsReleased_[key] = false;
                }
                else
                {
                    keyIsReleased_[key] = true;
                }
                break;
            }

            case ButtonPress:
            case ButtonRelease:
            {
                Mouse mouse;
                mouse.x              = static_cast<float>(event.xbutton.x);
                mouse.y              = static_cast<float>(event.xbutton.y);
                mouse.buttons.left   = event.xbutton.button == Button1;
                mouse.buttons.middle = event.xbutton.button == Button2;
                mouse.buttons.right  = event.xbutton.button == Button3;
                if (event.type == ButtonPress)
                {
                    if (listener())
                        listener()->onMouseButtonDown(wrapper() ? *wrapper() : *(DisplayInterface*)this, mouse);
                }
                else
                {
                    if (listener())
                        listener()->onMouseButtonUp(wrapper() ? *wrapper() : *(DisplayInterface*)this, mouse);
                }
                break;
            }
            case MotionNotify:
            {
                Mouse mouse;
                mouse.x              = static_cast<float>(event.xmotion.x);
                mouse.y              = static_cast<float>(event.xmotion.y);
                mouse.buttons.left   = event.xmotion.state & Button1Mask;
                mouse.buttons.middle = event.xmotion.state & Button2Mask;
                mouse.buttons.right  = event.xmotion.state & Button3Mask;
                if (listener())
                    listener()->onMouseMove(wrapper() ? *wrapper() : *(DisplayInterface*)this, mouse);
                break;
            }
            case ClientMessage:
            {
                if (event.xclient.message_type == wmProtocols_ &&
                    event.xclient.format == 32 &&
                    event.xclient.data.l[0] == (long)wmDeleteWindow_)
                {
                    if (listener())
                    {
                        if (listener()->onClose(wrapper() ? *wrapper() : *(DisplayInterface*)this))
                            isShuttingDown_ = true;
                    }
                    else
                    {
                        isShuttingDown_ = true;
                    }
                }
                break;
            }
        }
    }